

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttt.cpp
# Opt level: O1

void __thiscall ttt::Board::Print(Board *this)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  int i;
  long lVar4;
  char local_3b [3];
  Board *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player to move: ",0x10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)this->player);
  local_3b[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3b + 2,1);
  lVar4 = 0;
  local_38 = this;
  do {
    lVar3 = -3;
    do {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,(uint)(this->board)._M_elems[1]._M_elems[lVar3]);
      local_3b[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3b + 1,1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    local_3b[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3b,1);
    lVar4 = lVar4 + 1;
    this = (Board *)((this->board)._M_elems + 1);
  } while (lVar4 != 3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Status: ",8);
  iVar1 = GetStatus(local_38);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\n",2);
  return;
}

Assistant:

void
Board::Print() const
{
    std::cout << "Player to move: " << static_cast<int>(player) << '\n';
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
            std::cout << static_cast<int>(board[i][j]) << ' ';
        std::cout << '\n';
    }
    std::cout << "Status: " << GetStatus() << "\n\n";
}